

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::TestCaseTracking::TrackerBase::name_abi_cxx11_
          (string *__return_storage_ptr__,TrackerBase *this)

{
  TrackerBase *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const CATCH_OVERRIDE {
            return m_name;
        }